

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O2

int __thiscall TFileNameDatabase::LoadFromStream(TFileNameDatabase *this,TByteStream *InStream)

{
  DWORD *pDVar1;
  int iVar2;
  TFileNameDatabase *this_00;
  
  iVar2 = TSparseArray::LoadFromStream(&this->CollisionTable,InStream);
  if (((((iVar2 == 0) &&
        (iVar2 = TSparseArray::LoadFromStream(&this->FileNameIndexes,InStream), iVar2 == 0)) &&
       (iVar2 = TSparseArray::LoadFromStream(&this->CollisionHiBitsIndexes,InStream), iVar2 == 0))
      && ((iVar2 = TGenericArray<unsigned_char>::LoadFromStream(&this->LoBitsTable,InStream),
          iVar2 == 0 &&
          (iVar2 = TBitEntryArray::LoadBitsFromStream(&this->HiBitsTable,InStream), iVar2 == 0))))
     && (iVar2 = TPathFragmentTable::LoadFromStream(&this->PathFragmentTable,InStream), iVar2 == 0))
  {
    if (((this->CollisionHiBitsIndexes).ValidItemCount != 0) &&
       ((this->PathFragmentTable).PathFragments.ItemCount == 0)) {
      this_00 = (TFileNameDatabase *)operator_new(0x248);
      TFileNameDatabase(this_00);
      iVar2 = SetChildDatabase(this,this_00);
      if (iVar2 != 0) {
        return iVar2;
      }
      iVar2 = LoadFromStream(this->pChildDB,InStream);
      if (iVar2 != 0) {
        return iVar2;
      }
    }
    iVar2 = TGenericArray<_HASH_ENTRY>::LoadFromStream(&this->HashTable,InStream);
    if (iVar2 == 0) {
      this->HashTableMask = (this->HashTable).ItemCount - 1;
      iVar2 = TByteStream::GetValue<unsigned_int>(InStream,&this->field_214);
      if (iVar2 == 0) {
        iVar2 = 1000;
        if (3 < InStream->cbByteData) {
          pDVar1 = (DWORD *)InStream->pbByteData;
          InStream->pbByteData = (LPBYTE)(pDVar1 + 1);
          InStream->cbByteData = InStream->cbByteData - 4;
          iVar2 = TStruct10::sub_19572E0(&this->Struct10,*pDVar1);
          return iVar2;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int LoadFromStream(TByteStream & InStream)
    {
        DWORD dwBitMask;
        int nError;

        nError = CollisionTable.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        nError = FileNameIndexes.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        nError = CollisionHiBitsIndexes.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        // HOTS: 019597CD
        nError = LoBitsTable.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        nError = HiBitsTable.LoadBitsFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        // HOTS: 019597F5
        nError = PathFragmentTable.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        // HOTS: 0195980A
        if(CollisionHiBitsIndexes.ValidItemCount != 0 && PathFragmentTable.PathFragments.ItemCount == 0)
        {
            TFileNameDatabase * pNewDB;

            pNewDB = new TFileNameDatabase;
            if (pNewDB == NULL)
                return ERROR_NOT_ENOUGH_MEMORY;

            nError = SetChildDatabase(pNewDB);
            if(nError != ERROR_SUCCESS)
                return nError;

            nError = pChildDB->LoadFromStream(InStream);
            if(nError != ERROR_SUCCESS)
                return nError;
        }

        // HOTS: 0195986B
        nError = HashTable.LoadFromStream(InStream);
        if(nError != ERROR_SUCCESS)
            return nError;

        HashTableMask = HashTable.ItemCount - 1;

        nError = InStream.GetValue<DWORD>(field_214);
        if(nError != ERROR_SUCCESS)
            return nError;

        nError = InStream.GetValue<DWORD>(dwBitMask);
        if(nError != ERROR_SUCCESS)
            return nError;

        return Struct10.sub_1957800(dwBitMask);
    }